

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O0

bool __thiscall ZAP::ArchiveBuilder::removeFile(ArchiveBuilder *this,string *virtual_path)

{
  bool bVar1;
  __type _Var2;
  reference pEVar3;
  Entry *entry;
  _Self local_28;
  iterator it;
  string *virtual_path_local;
  ArchiveBuilder *this_local;
  
  it._M_node = (_Base_ptr)virtual_path;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<ZAP::ArchiveBuilder::Entry,_std::less<ZAP::ArchiveBuilder::Entry>,_std::allocator<ZAP::ArchiveBuilder::Entry>_>
       ::begin(&this->files);
  while( true ) {
    entry = (Entry *)std::
                     set<ZAP::ArchiveBuilder::Entry,_std::less<ZAP::ArchiveBuilder::Entry>,_std::allocator<ZAP::ArchiveBuilder::Entry>_>
                     ::end(&this->files);
    bVar1 = std::operator!=(&local_28,(_Self *)&entry);
    if (!bVar1) {
      return false;
    }
    pEVar3 = std::_Rb_tree_const_iterator<ZAP::ArchiveBuilder::Entry>::operator*(&local_28);
    _Var2 = std::operator==(&pEVar3->virtual_path,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            it._M_node);
    if (_Var2) break;
    std::_Rb_tree_const_iterator<ZAP::ArchiveBuilder::Entry>::operator++(&local_28);
  }
  std::
  set<ZAP::ArchiveBuilder::Entry,std::less<ZAP::ArchiveBuilder::Entry>,std::allocator<ZAP::ArchiveBuilder::Entry>>
  ::erase_abi_cxx11_((set<ZAP::ArchiveBuilder::Entry,std::less<ZAP::ArchiveBuilder::Entry>,std::allocator<ZAP::ArchiveBuilder::Entry>>
                      *)this,(const_iterator)local_28._M_node);
  return true;
}

Assistant:

bool ArchiveBuilder::removeFile(const std::string &virtual_path)
	{
		for (FileList::iterator it = files.begin(); it != files.end(); ++it)
		{
			const Entry &entry = (*it);
			if (entry.virtual_path == virtual_path)
			{
				files.erase(it);
				return true;
			}
		}
		return false;
	}